

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O1

void ie_pack(vmd_bst_node_t *head,int in_tree,vmd_bst_node_t **pack)

{
  for (; head != (vmd_bst_node_t *)0x0; head = head->next) {
    if ((*(uint *)&head->field_0x20 >> 4 & 1) == in_tree) {
      *pack = head;
      pack = pack + 1;
      if ((in_tree != 0) || ((head->field_0x20 & 0x40) == 0)) {
        head->field_0x20 = head->field_0x20 & 0xbf;
      }
    }
    head->field_0x20 = head->field_0x20 & 0xdf;
  }
  return;
}

Assistant:

static void
ie_pack(bst_node_t *head, int in_tree, bst_node_t **pack)
{
	for (; head != NULL; head = head->next) {
		if (head->in_tree == in_tree) {
			*pack++ = head;
			if (head->saved && !in_tree)
				; //node was changed and erased; need to restore it
			else
				head->saved = 0;
		}
		head->inserted = 0;
	}
}